

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_const_char_*,_int,_const_char_*>
* fmt::v6::internal::make_args_checked<char_const*&,int&,char_const*&,char[28],char>
            (char (*format_str) [28],remove_reference_t<const_char_*&> *args,
            remove_reference_t<int_&> *args_1,remove_reference_t<const_char_*&> *args_2)

{
  char (*in_RSI) [28];
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_const_char_*,_int,_const_char_*>
  *in_RDI;
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_const_char_*,_int,_const_char_*>
  *in_R8;
  char **in_stack_ffffffffffffffc8;
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_const_char_*,_int,_const_char_*>
  *args_00;
  
  args_00 = in_RDI;
  check_format_string<const_char_*&,_int_&,_const_char_*&,_char[28],_0>(in_RSI);
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_const_char_*,_int,_const_char_*>
  ::format_arg_store(in_R8,(char **)args_00,(int *)in_RDI,in_stack_ffffffffffffffc8);
  return args_00;
}

Assistant:

inline format_arg_store<buffer_context<Char>, remove_reference_t<Args>...>
make_args_checked(const S& format_str,
                  const remove_reference_t<Args>&... args) {
  static_assert(
      all_true<(!std::is_base_of<view, remove_reference_t<Args>>::value ||
                !std::is_reference<Args>::value)...>::value,
      "passing views as lvalues is disallowed");
  check_format_string<Args...>(format_str);
  return {args...};
}